

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int json_emit_va(char *s,int s_len,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  undefined8 *local_158;
  undefined8 *local_128;
  undefined8 *local_110;
  undefined8 *local_f8;
  undefined8 *local_e0;
  undefined8 *local_c8;
  double *local_b0;
  long *local_80;
  size_t len;
  char *orig;
  char *str;
  char *end;
  __va_list_tag *ap_local;
  char *fmt_local;
  char *pcStack_18;
  int s_len_local;
  char *s_local;
  
  pcVar5 = s + s_len;
  pcStack_18 = s;
  for (ap_local = (__va_list_tag *)fmt; iVar4 = (int)pcStack_18, (char)ap_local->gp_offset != '\0';
      ap_local = (__va_list_tag *)((long)&ap_local->gp_offset + 1)) {
    iVar3 = (int)pcVar5;
    switch((char)ap_local->gp_offset) {
    case '\t':
    case '\n':
    case '\r':
    case ' ':
    case ',':
    case ':':
    case '[':
    case ']':
    case '{':
    case '}':
      if (pcStack_18 < pcVar5) {
        *pcStack_18 = (char)ap_local->gp_offset;
      }
      pcStack_18 = pcStack_18 + 1;
      break;
    default:
      return 0;
    case 'F':
      iVar4 = json_emit_unquoted_str(pcStack_18,iVar3 - iVar4,"false",5);
      pcStack_18 = pcStack_18 + iVar4;
      break;
    case 'N':
      iVar4 = json_emit_unquoted_str(pcStack_18,iVar3 - iVar4,"null",4);
      pcStack_18 = pcStack_18 + iVar4;
      break;
    case 'S':
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_158 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_158 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_158 + 1;
      }
      pcVar2 = (char *)*local_158;
      sVar6 = strlen(pcVar2);
      iVar4 = json_emit_unquoted_str(pcStack_18,iVar3 - iVar4,pcVar2,(int)sVar6);
      pcStack_18 = pcStack_18 + iVar4;
      break;
    case 'T':
      iVar4 = json_emit_unquoted_str(pcStack_18,iVar3 - iVar4,"true",4);
      pcStack_18 = pcStack_18 + iVar4;
      break;
    case 'V':
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_f8 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_f8 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_f8 + 1;
      }
      pcVar2 = (char *)*local_f8;
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_110 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_110 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_110 + 1;
      }
      iVar4 = json_emit_unquoted_str(pcStack_18,iVar3 - iVar4,pcVar2,(int)*local_110);
      pcStack_18 = pcStack_18 + iVar4;
      break;
    case 'f':
      uVar1 = ap->fp_offset;
      if (uVar1 < 0xa1) {
        local_b0 = (double *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->fp_offset = uVar1 + 0x10;
      }
      else {
        local_b0 = (double *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_b0 + 1;
      }
      iVar4 = json_emit_double(pcStack_18,iVar3 - iVar4,*local_b0);
      pcStack_18 = pcStack_18 + iVar4;
      break;
    case 'i':
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_80 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_80 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_80 + 1;
      }
      iVar4 = json_emit_long(pcStack_18,iVar3 - iVar4,*local_80);
      pcStack_18 = pcStack_18 + iVar4;
      break;
    case 's':
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_128 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_128 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_128 + 1;
      }
      pcVar2 = (char *)*local_128;
      sVar6 = strlen(pcVar2);
      iVar4 = json_emit_quoted_str(pcStack_18,iVar3 - iVar4,pcVar2,(int)sVar6);
      pcStack_18 = pcStack_18 + iVar4;
      break;
    case 'v':
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_c8 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_c8 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_c8 + 1;
      }
      pcVar2 = (char *)*local_c8;
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_e0 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_e0 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_e0 + 1;
      }
      iVar4 = json_emit_quoted_str(pcStack_18,iVar3 - iVar4,pcVar2,(int)*local_e0);
      pcStack_18 = pcStack_18 + iVar4;
    }
  }
  if (pcStack_18 < pcVar5) {
    *pcStack_18 = '\0';
  }
  return iVar4 - (int)s;
}

Assistant:

int json_emit_va(char *s, int s_len, const char *fmt, va_list ap) {
    const char *end = s + s_len, *str, *orig = s;
    size_t len;

    while (*fmt != '\0') {
        switch (*fmt) {
            case '[':
            case ']':
            case '{':
            case '}':
            case ',':
            case ':':
            case ' ':
            case '\r':
            case '\n':
            case '\t':
                if (s < end) {
                    *s = *fmt;
                }
                s++;
                break;
            case 'i':
                s += json_emit_long(s, end - s, va_arg(ap, long));
                break;
            case 'f':
                s += json_emit_double(s, end - s, va_arg(ap, double));
                break;
            case 'v':
                str = va_arg(ap, char *);
                len = va_arg(ap, size_t);
                s += json_emit_quoted_str(s, end - s, str, len);
                break;
            case 'V':
                str = va_arg(ap, char *);
                len = va_arg(ap, size_t);
                s += json_emit_unquoted_str(s, end - s, str, len);
                break;
            case 's':
                str = va_arg(ap, char *);
                s += json_emit_quoted_str(s, end - s, str, strlen(str));
                break;
            case 'S':
                str = va_arg(ap, char *);
                s += json_emit_unquoted_str(s, end - s, str, strlen(str));
                break;
            case 'T':
                s += json_emit_unquoted_str(s, end - s, "true", 4);
                break;
            case 'F':
                s += json_emit_unquoted_str(s, end - s, "false", 5);
                break;
            case 'N':
                s += json_emit_unquoted_str(s, end - s, "null", 4);
                break;
            default:
                return 0;
        }
        fmt++;
    }

    /* Best-effort to 0-terminate generated string */
    if (s < end) {
        *s = '\0';
    }

    return s - orig;
}